

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boyer_moore.hpp
# Opt level: O2

__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::detail::
boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::find_nocase_(boyer_moore<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  ctype<char> *pcVar1;
  char cVar2;
  byte bVar3;
  difference_type __d;
  ulong uVar4;
  long lVar5;
  diff_type curpos;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  
  lVar5 = (long)end._M_current - (long)begin._M_current;
  uVar4 = (ulong)this->length_;
  uVar6 = uVar4;
  do {
    if (lVar5 <= (long)uVar6) {
      return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )end._M_current;
    }
    begin._M_current = begin._M_current + uVar4;
    pcVar8 = begin._M_current;
    for (pcVar7 = this->last_; pcVar1 = (tr->super_cpp_regex_traits<char>).ctype_,
        cVar2 = (**(code **)(*(long *)pcVar1 + 0x20))(pcVar1,(int)*pcVar8), cVar2 == *pcVar7;
        pcVar7 = pcVar7 + -1) {
      if (pcVar7 == this->begin_) {
        return (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )pcVar8;
      }
      pcVar8 = pcVar8 + -1;
    }
    pcVar1 = (tr->super_cpp_regex_traits<char>).ctype_;
    bVar3 = (**(code **)(*(long *)pcVar1 + 0x20))(pcVar1,(int)*begin._M_current);
    uVar4 = (ulong)this->offsets_[bVar3];
    uVar6 = uVar6 + uVar4;
  } while( true );
}

Assistant:

BidiIter find_nocase_(BidiIter begin, BidiIter end, Traits const &tr) const
    {
        typedef typename boost::iterator_difference<BidiIter>::type diff_type;
        diff_type const endpos = std::distance(begin, end);
        diff_type offset = static_cast<diff_type>(this->length_);

        for(diff_type curpos = offset; curpos < endpos; curpos += offset)
        {
            std::advance(begin, offset);

            char_type const *pat_tmp = this->last_;
            BidiIter str_tmp = begin;

            for(; tr.translate_nocase(*str_tmp) == *pat_tmp; --pat_tmp, --str_tmp)
            {
                if(pat_tmp == this->begin_)
                {
                    return str_tmp;
                }
            }

            offset = this->offsets_[tr.hash(tr.translate_nocase(*begin))];
        }

        return end;
    }